

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseUicInclude
          (JobParseT *this,WorkerT *wrk,MetaT *meta,string *includeString)

{
  pointer pcVar1;
  bool bVar2;
  const_iterator cVar3;
  JobUicT *this_00;
  pointer *__ptr;
  string uiInputFile;
  _Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false> local_78;
  string local_70;
  string local_50;
  
  UicFindIncludedFile(&local_70,this,wrk,meta,includeString);
  if (local_70._M_string_length == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((wrk->Gen_->Uic_).Enabled == true) {
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(wrk->Gen_->Uic_).SkipList._M_h,&local_70);
      if (cVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        this_00 = (JobUicT *)operator_new(0x88);
        pcVar1 = (this->FileName)._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + (this->FileName)._M_string_length);
        JobUicT::JobUicT(this_00,&local_70,&local_50,includeString);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_78._M_head_impl = (JobT *)this_00;
        bVar2 = ParallelJobPushUic(wrk->Gen_,(JobHandleT *)&local_78);
        if ((JobUicT *)local_78._M_head_impl != (JobUicT *)0x0) {
          (*((JobT *)&(local_78._M_head_impl)->_vptr_JobT)->_vptr_JobT[1])();
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseUicInclude(
  WorkerT& wrk, MetaT const& meta, std::string&& includeString)
{
  bool success = false;
  std::string uiInputFile = UicFindIncludedFile(wrk, meta, includeString);
  if (!uiInputFile.empty()) {
    if (!wrk.Uic().skipped(uiInputFile)) {
      JobHandleT jobHandle = cm::make_unique<JobUicT>(
        std::move(uiInputFile), FileName, std::move(includeString));
      success = wrk.Gen().ParallelJobPushUic(jobHandle);
    } else {
      // A skipped file is successful
      success = true;
    }
  }
  return success;
}